

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int uncompress2file(char *filename,FILE *indiskfile,FILE *outdiskfile,int *status)

{
  void *pvVar1;
  int iVar2;
  void *__ptr;
  size_t sVar3;
  void *local_c0;
  z_stream d_stream;
  char *outfilebuff;
  char *infilebuff;
  unsigned_long bytes_out;
  int len;
  int err;
  int *status_local;
  FILE *outdiskfile_local;
  FILE *indiskfile_local;
  char *filename_local;
  
  infilebuff = (char *)0x0;
  if (*status < 1) {
    __ptr = malloc(0x1c200);
    if (__ptr == (void *)0x0) {
      *status = 0x71;
      filename_local._4_4_ = 0x71;
    }
    else {
      d_stream.total_in = (uLong)malloc(0x1c200);
      if ((void *)d_stream.total_in == (void *)0x0) {
        *status = 0x71;
        filename_local._4_4_ = 0x71;
      }
      else {
        d_stream.state = (internal_state *)0x0;
        d_stream.zalloc = (alloc_func)0x0;
        d_stream.zfree = (free_func)0x0;
        d_stream.next_out._0_4_ = 0x1c200;
        d_stream.reserved = d_stream.total_in;
        iVar2 = inflateInit2_(&local_c0,0x1f,"1.2.11",0x70);
        if (iVar2 == 0) {
          do {
            sVar3 = fread(__ptr,1,0x1c200,(FILE *)indiskfile);
            iVar2 = ferror((FILE *)indiskfile);
            if (iVar2 != 0) {
              inflateEnd(&local_c0);
              free(__ptr);
              free((void *)d_stream.reserved);
              *status = 0x19e;
              return 0x19e;
            }
            pvVar1 = __ptr;
            iVar2 = (int)sVar3;
            if ((int)sVar3 == 0) break;
            while (d_stream.next_in._0_4_ = iVar2, local_c0 = pvVar1, iVar2 = inflate(&local_c0,0),
                  iVar2 != 1) {
              if ((iVar2 != 0) && (iVar2 != -5)) {
                inflateEnd(&local_c0);
                free(__ptr);
                free((void *)d_stream.reserved);
                *status = 0x19e;
                return 0x19e;
              }
              if ((int)d_stream.next_in == 0) break;
              sVar3 = fwrite((void *)d_stream.reserved,1,0x1c200,(FILE *)outdiskfile);
              if ((int)sVar3 != 0x1c200) {
                inflateEnd(&local_c0);
                free(__ptr);
                free((void *)d_stream.reserved);
                *status = 0x19e;
                return 0x19e;
              }
              infilebuff = infilebuff + 0x1c200;
              d_stream.total_in = d_stream.reserved;
              d_stream.next_out._0_4_ = 0x1c200;
              pvVar1 = local_c0;
              iVar2 = (int)d_stream.next_in;
            }
            iVar2 = feof((FILE *)indiskfile);
          } while (iVar2 == 0);
          if ((infilebuff < (ulong)d_stream._32_8_) &&
             (sVar3 = fwrite((void *)d_stream.reserved,1,d_stream._32_8_ - (long)infilebuff,
                             (FILE *)outdiskfile),
             (long)(int)sVar3 != d_stream._32_8_ - (long)infilebuff)) {
            inflateEnd(&local_c0);
            free(__ptr);
            free((void *)d_stream.reserved);
            *status = 0x19e;
            filename_local._4_4_ = 0x19e;
          }
          else {
            free(__ptr);
            free((void *)d_stream.reserved);
            iVar2 = inflateEnd(&local_c0);
            if (iVar2 == 0) {
              filename_local._4_4_ = *status;
            }
            else {
              *status = 0x19e;
              filename_local._4_4_ = 0x19e;
            }
          }
        }
        else {
          *status = 0x19e;
          filename_local._4_4_ = 0x19e;
        }
      }
    }
  }
  else {
    filename_local._4_4_ = *status;
  }
  return filename_local._4_4_;
}

Assistant:

int uncompress2file(char *filename,  /* name of input file                  */
             FILE *indiskfile,     /* I - input file pointer                */
             FILE *outdiskfile,    /* I - output file pointer               */
             int *status)        /* IO - error status                       */
/*
  Uncompress the file into another file. 
*/
{
    int err, len;
    unsigned long bytes_out = 0;
    char *infilebuff, *outfilebuff;
    z_stream d_stream;   /* decompression stream */

    if (*status > 0) 
        return(*status); 

    /* Allocate buffers to hold compressed and uncompressed */
    infilebuff = (char*)malloc(GZBUFSIZE);
    if (!infilebuff) return(*status = 113); /* memory error */

    outfilebuff = (char*)malloc(GZBUFSIZE);
    if (!outfilebuff) return(*status = 113); /* memory error */

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;

    d_stream.next_out = (unsigned char*) outfilebuff;
    d_stream.avail_out = GZBUFSIZE;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */

    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    /* loop through the file, reading a buffer and uncompressing it */
    for (;;)
    {
        len = fread(infilebuff, 1, GZBUFSIZE, indiskfile);
	if (ferror(indiskfile)) {
              inflateEnd(&d_stream);
              free(infilebuff);
              free(outfilebuff);
              return(*status = 414);
	}

        if (len == 0) break;  /* no more data */

        d_stream.next_in = (unsigned char*)infilebuff;
        d_stream.avail_in = len;

        for (;;) {
            /* uncompress as much of the input as will fit in the output */
            err = inflate(&d_stream, Z_NO_FLUSH);

            if (err == Z_STREAM_END ) { /* We reached the end of the input */
	        break; 
            } else if (err == Z_OK || err == Z_BUF_ERROR) { 
	        /* Z_BUF_ERROR means need more input data to make progress */

                if (!d_stream.avail_in) break; /* need more input */
		
                /* flush out the full output buffer */
                if ((int)fwrite(outfilebuff, 1, GZBUFSIZE, outdiskfile) != GZBUFSIZE) {
                    inflateEnd(&d_stream);
                    free(infilebuff);
                    free(outfilebuff);
                    return(*status = 414);
                }
                bytes_out += GZBUFSIZE;
                d_stream.next_out = (unsigned char*) outfilebuff;
                d_stream.avail_out = GZBUFSIZE;

            } else {  /* some other error */
                inflateEnd(&d_stream);
                free(infilebuff);
                free(outfilebuff);
                return(*status = 414);
            }
        }
	
	if (feof(indiskfile))  break;
    }

    /* write out any remaining bytes in the buffer */
    if (d_stream.total_out > bytes_out) {
        if ((int)fwrite(outfilebuff, 1, (d_stream.total_out - bytes_out), outdiskfile) 
	    != (d_stream.total_out - bytes_out)) {
            inflateEnd(&d_stream);
            free(infilebuff);
            free(outfilebuff);
            return(*status = 414);
        }
    }

    free(infilebuff); /* free temporary output data buffer */
    free(outfilebuff); /* free temporary output data buffer */

    err = inflateEnd(&d_stream); /* End the decompression */
    if (err != Z_OK) return(*status = 414);
  
    return(*status);
}